

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::BufferVkImpl::InvalidateMappedRange(BufferVkImpl *this,Uint64 StartOffset,Uint64 Size)

{
  VulkanLogicalDevice *this_00;
  VulkanPhysicalDevice *pVVar1;
  RenderDeviceVkImpl *pRVar2;
  type tVar3;
  type tVar4;
  VkMappedMemoryRange local_58;
  
  BufferBase<Diligent::EngineVkImplTraits>::DvpVerifyInvalidateMappedRangeArguments
            (&this->super_BufferBase<Diligent::EngineVkImplTraits>,StartOffset,Size);
  pRVar2 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)this);
  this_00 = (pRVar2->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  pRVar2 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)this);
  pVVar1 = (pRVar2->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  local_58.pNext = (void *)0x0;
  local_58.sType = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
  local_58._4_4_ = 0;
  local_58.memory = (((this->m_MemoryAllocation).Page)->m_VkMemory).m_VkObject;
  tVar3 = AlignDown<unsigned_long,unsigned_long>
                    (this->m_BufferMemoryAlignedOffset + StartOffset,
                     *(VkDeviceSize *)((long)&(pVVar1->m_Properties).limits + 0x1f0));
  local_58.offset = tVar3;
  tVar4 = AlignUp<unsigned_long,unsigned_long>
                    (Size + StartOffset + this->m_BufferMemoryAlignedOffset,
                     *(VkDeviceSize *)((long)&(pVVar1->m_Properties).limits + 0x1f0));
  local_58.size = tVar4 - tVar3;
  VulkanUtilities::VulkanLogicalDevice::InvalidateMappedMemoryRanges(this_00,1,&local_58);
  return;
}

Assistant:

void BufferVkImpl::InvalidateMappedRange(Uint64 StartOffset, Uint64 Size)
{
    DvpVerifyInvalidateMappedRangeArguments(StartOffset, Size);

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = GetDevice()->GetLogicalDevice();
    const VkPhysicalDeviceLimits&               DeviceLimits  = GetDevice()->GetPhysicalDevice().GetProperties().limits;

    VkMappedMemoryRange MappedRange{};
    MappedRange.sType  = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
    MappedRange.memory = m_MemoryAllocation.Page->GetVkMemory();
    MappedRange.offset = AlignDown(m_BufferMemoryAlignedOffset + StartOffset, DeviceLimits.nonCoherentAtomSize);
    MappedRange.size   = AlignUp(m_BufferMemoryAlignedOffset + StartOffset + Size, DeviceLimits.nonCoherentAtomSize) - MappedRange.offset;
    LogicalDevice.InvalidateMappedMemoryRanges(1, &MappedRange);
}